

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnFunctionSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index func_index)

{
  Module *pMVar1;
  Func *pFVar2;
  string_view name_00;
  string *orig_name;
  string dollar_name;
  string local_78;
  __buckets_ptr local_58;
  undefined4 uStackY_50;
  undefined4 uStackY_4c;
  undefined4 uStackY_48;
  undefined4 uStackY_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  orig_name = (string *)name.data_;
  if (name.size_ != 0) {
    pMVar1 = this->module_;
    pFVar2 = (pMVar1->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start[func_index];
    if ((pFVar2->name)._M_string_length == 0) {
      name_00.data_._4_4_ = in_stack_ffffffffffffffc4;
      name_00.data_._0_4_ = in_stack_ffffffffffffffc0;
      name_00.size_._0_4_ = in_stack_ffffffffffffffc8;
      name_00.size_._4_4_ = in_stack_ffffffffffffffcc;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_00);
      GetUniqueName(&local_78,(BinaryReaderIR *)&pMVar1->func_bindings,(BindingHash *)&local_58,
                    orig_name);
      if (local_58 != (__buckets_ptr)&uStackY_48) {
        operator_delete(local_58);
      }
      std::__cxx11::string::_M_assign((string *)pFVar2);
      uStackY_48 = 0;
      uStackY_44 = 0;
      local_58 = (__buckets_ptr)0x0;
      uStackY_50 = 0;
      uStackY_4c = 0;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->module_->func_bindings,0,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
  }
  return (Result)Ok;
}

Assistant:

constexpr inline bool string_view::empty() const noexcept {
  return size_ == 0;
}